

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O3

void __thiscall Bracket::~Bracket(Bracket *this)

{
  list<Atom_*,_std::allocator<Atom_*>_> *plVar1;
  _List_node_base *p_Var2;
  pointer pcVar3;
  _Node *__tmp;
  _List_node_base *p_Var4;
  
  (this->super_Atom)._vptr_Atom = (_func_int **)&PTR__Bracket_00109c38;
  plVar1 = &this->para;
  p_Var4 = (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)plVar1) {
    do {
      if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
        (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 8))();
        p_Var4[1]._M_next = (_List_node_base *)0x0;
      }
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)plVar1);
    p_Var4 = (plVar1->super__List_base<Atom_*,_std::allocator<Atom_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  }
  while (p_Var4 != (_List_node_base *)plVar1) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var2;
  }
  pcVar3 = (this->func)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->func).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

Bracket::~Bracket() {
    auto cursor = para.begin();
    while (cursor != para.end()) {
        if (*cursor != NULL) {
            delete *cursor;
            *cursor = NULL;
        }
        cursor++;
    }
}